

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_set.h
# Opt level: O2

void __thiscall duckdb_re2::SparseSetT<void>::~SparseSetT(SparseSetT<void> *this)

{
  std::unique_ptr<int[],_duckdb_re2::PODArray<int>::Deleter>::~unique_ptr(&(this->dense_).ptr_);
  std::unique_ptr<int[],_duckdb_re2::PODArray<int>::Deleter>::~unique_ptr(&(this->sparse_).ptr_);
  return;
}

Assistant:

SparseSetT<Value>::~SparseSetT() {
  DebugCheckInvariants();
}